

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void get_mime_type(mg_connection *conn,char *path,vec *vec)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t path_len;
  char *ext;
  char *list;
  vec mime_vec;
  vec ext_vec;
  vec *vec_local;
  char *path_local;
  mg_connection *conn_local;
  
  sVar2 = strlen(path);
  if ((conn == (mg_connection *)0x0) || (vec == (vec *)0x0)) {
    if (vec != (vec *)0x0) {
      memset(vec,0,0x10);
    }
  }
  else {
    ext = conn->dom_ctx->config[0x26];
    do {
      ext = next_option(ext,(vec *)&mime_vec.len,(vec *)&list);
      if (ext == (char *)0x0) {
        pcVar3 = mg_get_builtin_mime_type(path);
        vec->ptr = pcVar3;
        sVar2 = strlen(vec->ptr);
        vec->len = sVar2;
        return;
      }
      iVar1 = mg_strncasecmp(path + (sVar2 - (long)ext_vec.ptr),(char *)mime_vec.len,
                             (size_t)ext_vec.ptr);
    } while (iVar1 != 0);
    vec->ptr = list;
    vec->len = (size_t)mime_vec.ptr;
  }
  return;
}

Assistant:

static void
get_mime_type(struct mg_connection *conn, const char *path, struct vec *vec)
{
	struct vec ext_vec, mime_vec;
	const char *list, *ext;
	size_t path_len;

	path_len = strlen(path);

	if ((conn == NULL) || (vec == NULL)) {
		if (vec != NULL) {
			memset(vec, '\0', sizeof(struct vec));
		}
		return;
	}

	/* Scan user-defined mime types first, in case user wants to
	 * override default mime types. */
	list = conn->dom_ctx->config[EXTRA_MIME_TYPES];
	while ((list = next_option(list, &ext_vec, &mime_vec)) != NULL) {
		/* ext now points to the path suffix */
		ext = path + path_len - ext_vec.len;
		if (mg_strncasecmp(ext, ext_vec.ptr, ext_vec.len) == 0) {
			*vec = mime_vec;
			return;
		}
	}

	vec->ptr = mg_get_builtin_mime_type(path);
	vec->len = strlen(vec->ptr);
}